

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_FontFaceQuartet * __thiscall
ON_Font::FontQuartet(ON_FontFaceQuartet *__return_storage_ptr__,ON_Font *this)

{
  bool bVar1;
  wchar_t *pwVar2;
  ON_FontList *pOVar3;
  ON_wString *local_108;
  bool local_bd;
  bool local_bb;
  uint local_80;
  int i_1;
  uint local_74;
  int i;
  int imax;
  int imin;
  ON_SHA1_Hash local_54;
  ON_Font *local_30;
  undefined1 local_28 [16];
  ON_wString local_18;
  ON_Font *this_local;
  ON_FontFaceQuartet *installed_quartet;
  
  local_30 = (ON_Font *)local_28;
  local_18.m_s = (wchar_t *)this;
  this_local = (ON_Font *)__return_storage_ptr__;
  QuartetName(local_30);
  local_30 = (ON_Font *)(local_28 + 8);
  RichTextFontName(local_30);
  pwVar2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_28);
  FontNameHash((ON_SHA1_Hash *)&imax,pwVar2,false);
  pwVar2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_28 + 8));
  FontNameHash(&local_54,pwVar2,false);
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)local_28);
  local_80 = (byte)~bVar1 & 1;
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)(local_28 + 8));
  local_bb = false;
  if (bVar1) {
    bVar1 = ON_wString::IsEmpty((ON_wString *)local_28);
    local_bd = true;
    if (!bVar1) {
      local_bd = ::operator!=((ON_SHA1_Hash *)&imax,&local_54);
    }
    local_bb = local_bd;
  }
  for (local_74 = local_80; (int)local_74 <= (int)(uint)(local_bb != false); local_74 = local_74 + 1
      ) {
    pOVar3 = InstalledFontList();
    pwVar2 = ON_wString::operator_cast_to_wchar_t_
                       ((ON_wString *)(local_28 + (long)(int)local_74 * 8));
    ON_FontList::QuartetFromQuartetName(__return_storage_ptr__,pOVar3,pwVar2);
    bVar1 = ON_FontFaceQuartet::IsNotEmpty(__return_storage_ptr__);
    if (bVar1) goto LAB_006348a1;
    ON_FontFaceQuartet::~ON_FontFaceQuartet(__return_storage_ptr__);
  }
  for (; (int)local_80 <= (int)(uint)(local_bb != false); local_80 = local_80 + 1) {
    pOVar3 = ManagedFontList();
    pwVar2 = ON_wString::operator_cast_to_wchar_t_
                       ((ON_wString *)(local_28 + (long)(int)local_80 * 8));
    ON_FontList::QuartetFromQuartetName(__return_storage_ptr__,pOVar3,pwVar2);
    bVar1 = ON_FontFaceQuartet::IsNotEmpty(__return_storage_ptr__);
    if (bVar1) goto LAB_006348a1;
    ON_FontFaceQuartet::~ON_FontFaceQuartet(__return_storage_ptr__);
  }
  ON_FontFaceQuartet::ON_FontFaceQuartet(__return_storage_ptr__,&ON_FontFaceQuartet::Empty);
LAB_006348a1:
  local_108 = &local_18;
  do {
    local_108 = local_108 + -1;
    ON_wString::~ON_wString(local_108);
  } while (local_108 != (ON_wString *)local_28);
  return __return_storage_ptr__;
}

Assistant:

const ON_FontFaceQuartet ON_Font::FontQuartet() const
{
  const ON_wString quartet_name[2] = { QuartetName(), this->RichTextFontName() };
  const ON_SHA1_Hash quartet_name_hash[2] = { ON_Font::FontNameHash(quartet_name[0],false), ON_Font::FontNameHash(quartet_name[1],false) };
  
  const int imin = quartet_name[0].IsNotEmpty() ? 0 : 1;
  const int imax = (quartet_name[1].IsNotEmpty() && (quartet_name[0].IsEmpty() || quartet_name_hash[0] != quartet_name_hash[1])) ? 1 : 0;

  for (int i = imin; i <= imax; ++i)
  {
    ON_FontFaceQuartet installed_quartet = ON_Font::InstalledFontList().QuartetFromQuartetName(quartet_name[i]);
    if (installed_quartet.IsNotEmpty())
      return installed_quartet;
  }

  for (int i = imin; i <= imax; ++i)
  {
    ON_FontFaceQuartet managed_quartet = ON_Font::ManagedFontList().QuartetFromQuartetName(quartet_name[i]);
    if (managed_quartet.IsNotEmpty())
      return managed_quartet;
  }

  return ON_FontFaceQuartet::Empty;
}